

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void thread_pool_destroy(thread_pool *pool)

{
  int iVar1;
  ulong local_28;
  size_t i_1;
  void *return_value;
  size_t i;
  thread_pool *pool_local;
  
  if (pool != (thread_pool *)0x0) {
    i = (size_t)pool;
    iVar1 = sem_wait((sem_t *)&pool->pool_mutex);
    if (iVar1 != 0) {
      exit(-4);
    }
    *(undefined1 *)(i + 0x18) = 1;
    iVar1 = sem_post((sem_t *)(i + 0x78));
    if (iVar1 != 0) {
      exit(-4);
    }
    for (return_value = (void *)0x0; return_value < *(void **)(i + 8);
        return_value = (void *)((long)return_value + 1)) {
      iVar1 = sem_post((sem_t *)(i + 0x58));
      if (iVar1 != 0) {
        exit(-4);
      }
    }
    for (local_28 = 0; local_28 < *(ulong *)(i + 8); local_28 = local_28 + 1) {
      pthread_join(*(pthread_t *)(*(long *)i + local_28 * 8),(void **)&i_1);
    }
    pthread_attr_destroy((pthread_attr_t *)(i + 0x20));
    sem_destroy((sem_t *)(i + 0x58));
    sem_destroy((sem_t *)(i + 0x78));
    free(*(void **)(i + 0x10));
    free(*(void **)i);
  }
  return;
}

Assistant:

void thread_pool_destroy(struct thread_pool *pool) {
    /* Checks if the pointer is valid. */
    if(pool == NULL) {
        return;
    }
    if(sem_wait(&(pool->pool_mutex))){
        exit(semaphore_error);
    }

    /* Sets the flag for the threads. */
    pool->end = true;
    if(sem_post(&(pool->pool_mutex))) {
        exit(semaphore_error);
    }
    for(size_t i = 0; i < pool->size; i++) {
        if(sem_post(&(pool->runnables_semaphore))){
            exit(semaphore_error);
        }
    }

    void *return_value;
    for(size_t i = 0; i < pool->size; i++) {
        /* Waits, until all of the tasks are finished. */
        (pthread_join((pool->threads[i]), &return_value));
    }
    /* Destroys the pool */
    pthread_attr_destroy(&(pool->attr));
    sem_destroy(&(pool->runnables_semaphore));
    sem_destroy(&(pool->pool_mutex));
    free(pool->runnables);
    free(pool->threads);
}